

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::add_composite_member_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,SPIRType *var_type,uint32_t mbr_idx,InterfaceBlockMeta *meta,
          string *mbr_name_qual,string *var_chain_qual,uint32_t *location,uint32_t *var_mbr_idx,
          Bitset *interpolation_qual)

{
  size_type *psVar1;
  size_t sVar2;
  size_t sVar3;
  pointer pcVar4;
  SPIRType *pSVar5;
  bool bVar6;
  bool bVar7;
  uint32_t uVar8;
  SPIRFunction *pSVar9;
  SPIRType *pSVar10;
  SPIRType *pSVar11;
  undefined8 extraout_RAX;
  undefined8 *puVar12;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *this_00;
  size_type sVar13;
  size_type sVar14;
  mapped_type *pmVar15;
  code **ppcVar16;
  runtime_error *prVar17;
  uint32_t mbr_idx_00;
  ulong uVar18;
  undefined8 uVar19;
  CompilerMSL *this_01;
  char (*pacVar20) [2];
  SPIRType *ts_3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  StorageClass storage_00;
  bool local_261;
  bool local_25f;
  bool local_25e;
  bool local_25d;
  uint local_25c;
  SPIRType *local_258;
  ulong local_250;
  uint32_t local_244;
  undefined4 local_240;
  BuiltIn builtin;
  SPIRType *local_238;
  SPIRVariable *local_230;
  string var_chain_1;
  _Any_data local_208;
  code *local_1f8;
  code *pcStack_1f0;
  undefined4 local_1e4;
  string mbr_name;
  code *local_1c0;
  uint local_1b8;
  undefined4 uStack_1b4;
  undefined8 uStack_1b0;
  code **local_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  code *pcStack_198;
  code **local_190;
  code *local_188;
  code *local_180;
  undefined1 uStack_178;
  undefined7 uStack_177;
  uint local_170;
  undefined4 uStack_16c;
  code *local_168;
  code *local_160;
  undefined1 local_158;
  undefined7 uStack_157;
  code *pcStack_150;
  string var_chain;
  string local_108;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_e8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_e0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_d8;
  string flatten_from_ib_mbr_name;
  string local_90;
  Bitset inherited_qual;
  
  ts_3 = var_type;
  local_258 = ib_type;
  local_230 = var;
  pSVar9 = Variant::get<spirv_cross::SPIRFunction>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  builtin = BuiltInMax;
  local_238 = var_type;
  bVar6 = Compiler::is_member_builtin((Compiler *)this,var_type,mbr_idx,&builtin);
  local_25d = true;
  local_25f = true;
  if ((interpolation_qual->lower & 0x4000) == 0) {
    bVar7 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)(local_238->super_IVariant).self.id,mbr_idx,
                       DecorationFlat);
    local_25f = true;
    if (!bVar7) {
      local_25f = Compiler::has_decoration
                            ((Compiler *)this,(ID)(local_230->super_IVariant).self.id,DecorationFlat
                            );
    }
  }
  if (((interpolation_qual->lower & 0x2000) == 0) &&
     (bVar7 = Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)(local_238->super_IVariant).self.id,mbr_idx,
                         DecorationNoPerspective), !bVar7)) {
    local_25d = Compiler::has_decoration
                          ((Compiler *)this,(ID)(local_230->super_IVariant).self.id,
                           DecorationNoPerspective);
  }
  local_25e = true;
  local_261 = true;
  if ((interpolation_qual->lower & 0x10000) == 0) {
    bVar7 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)(local_238->super_IVariant).self.id,mbr_idx,
                       DecorationCentroid);
    local_261 = true;
    if (!bVar7) {
      local_261 = Compiler::has_decoration
                            ((Compiler *)this,(ID)(local_230->super_IVariant).self.id,
                             DecorationCentroid);
    }
  }
  if (((interpolation_qual->lower & 0x20000) == 0) &&
     (bVar7 = Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)(local_238->super_IVariant).self.id,mbr_idx,
                         DecorationSample), !bVar7)) {
    local_25e = Compiler::has_decoration
                          ((Compiler *)this,(ID)(local_230->super_IVariant).self.id,DecorationSample
                          );
  }
  inherited_qual.higher._M_h._M_buckets = &inherited_qual.higher._M_h._M_single_bucket;
  inherited_qual.lower = 0;
  inherited_qual.higher._M_h._M_bucket_count = 1;
  inherited_qual.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  inherited_qual.higher._M_h._M_element_count = 0;
  inherited_qual.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  inherited_qual.higher._M_h._M_rehash_policy._M_next_resize = 0;
  inherited_qual.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (local_25f != false) {
    inherited_qual.lower = 0x4000;
  }
  if (local_25d != false) {
    inherited_qual.lower = inherited_qual.lower | 0x2000;
  }
  if (local_261 != false) {
    inherited_qual.lower = CONCAT53(0,CONCAT12(1,(undefined2)inherited_qual.lower));
  }
  if (local_25e != false) {
    inherited_qual.lower = inherited_qual.lower | 0x20000;
  }
  uVar18 = (ulong)(local_238->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[mbr_idx].id;
  pSVar10 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + uVar18);
  bVar7 = Compiler::is_matrix((Compiler *)this,pSVar10);
  if (bVar7) {
    bVar7 = Compiler::is_array((Compiler *)this,pSVar10);
    if (bVar7) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (prVar17,"MSL cannot emit arrays-of-matrices in input and output variables.");
LAB_001c2b1e:
      *(undefined ***)prVar17 = &PTR__runtime_error_003a8f30;
      __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_244 = pSVar10->columns;
LAB_001c186c:
    local_240 = (undefined4)CONCAT71((uint7)(uint3)(local_244 >> 8),1);
  }
  else {
    bVar7 = Compiler::is_array((Compiler *)this,pSVar10);
    if (bVar7) {
      if ((pSVar10->array).super_VectorView<unsigned_int>.buffer_size != 1) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar17,"MSL cannot emit arrays-of-arrays in input and output variables.");
        goto LAB_001c2b1e;
      }
      local_244 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar10);
      goto LAB_001c186c;
    }
    local_244 = 1;
    local_240 = 0;
  }
  pSVar11 = pSVar10;
  if (pSVar10->pointer != false) {
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + (pSVar10->parent_type).id);
  }
  while ((bVar7 = Compiler::is_array((Compiler *)this,pSVar11), bVar7 ||
         (bVar7 = Compiler::is_matrix((Compiler *)this,pSVar11), pSVar5 = local_258, bVar7))) {
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + (pSVar11->parent_type).id);
  }
  flatten_from_ib_mbr_name._M_dataplus._M_p = (pointer)&flatten_from_ib_mbr_name.field_2;
  flatten_from_ib_mbr_name._M_string_length = 0;
  flatten_from_ib_mbr_name.field_2._M_local_buf[0] = '\0';
  if ((storage == StorageClassOutput) && (builtin == BuiltInClipDistance && bVar6)) {
    sVar2 = (local_258->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
            .buffer_size;
    local_250 = uVar18;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
              (&local_258->member_types,sVar2 + 1);
    sVar3 = (pSVar5->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size;
    (pSVar5->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar3]
    .id = (uint32_t)local_250;
    (pSVar5->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
    buffer_size = sVar3 + 1;
    uVar8 = (uint32_t)sVar2;
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(pSVar5->super_IVariant).self.id,uVar8,DecorationBuiltIn,3);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(&mbr_name,this,3,3);
    ::std::__cxx11::string::operator=((string *)&flatten_from_ib_mbr_name,(string *)&mbr_name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)mbr_name._M_dataplus._M_p != &mbr_name.field_2) {
      operator_delete(mbr_name._M_dataplus._M_p);
    }
    Compiler::set_member_name
              ((Compiler *)this,(TypeID)(local_258->super_IVariant).self.id,uVar8,
               &flatten_from_ib_mbr_name);
    local_1e4 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    if ((this->msl_options).enable_clip_distance_user_varying == false) goto LAB_001c2a6f;
  }
  else {
    local_1e4 = 0;
  }
  if (pSVar10->basetype == Struct) {
    local_25c = 0;
    if (local_244 != 0) {
      do {
        paVar21 = &var_chain_1.field_2;
        pSVar11 = local_238;
        append_member_name(&var_chain,this,mbr_name_qual,local_238,mbr_idx);
        if ((char)local_240 == '\0') {
          var_chain_1._M_dataplus._M_p = (pointer)paVar21;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&var_chain_1,"");
        }
        else {
          join<char_const(&)[2],unsigned_int&>
                    (&var_chain_1,(spirv_cross *)0x2f4e20,(char (*) [2])&local_25c,(uint *)pSVar11);
        }
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)var_chain._M_dataplus._M_p != &var_chain.field_2) {
          uVar19 = var_chain.field_2._M_allocated_capacity;
        }
        pacVar20 = (char (*) [2])var_chain._M_string_length;
        if ((ulong)uVar19 < var_chain_1._M_string_length + var_chain._M_string_length) {
          uVar19 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)var_chain_1._M_dataplus._M_p != paVar21) {
            uVar19 = var_chain_1.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar19 < var_chain_1._M_string_length + var_chain._M_string_length)
          goto LAB_001c1ae6;
          puVar12 = (undefined8 *)
                    ::std::__cxx11::string::replace
                              ((ulong)&var_chain_1,0,(char *)0x0,(ulong)var_chain._M_dataplus._M_p);
        }
        else {
LAB_001c1ae6:
          puVar12 = (undefined8 *)
                    ::std::__cxx11::string::_M_append
                              ((char *)&var_chain,(ulong)var_chain_1._M_dataplus._M_p);
        }
        mbr_name._M_dataplus._M_p = (pointer)&mbr_name.field_2;
        psVar1 = puVar12 + 2;
        if ((size_type *)*puVar12 == psVar1) {
          mbr_name.field_2._M_allocated_capacity = *psVar1;
          mbr_name.field_2._8_8_ = puVar12[3];
        }
        else {
          mbr_name.field_2._M_allocated_capacity = *psVar1;
          mbr_name._M_dataplus._M_p = (pointer)*puVar12;
        }
        mbr_name._M_string_length = puVar12[1];
        *puVar12 = psVar1;
        puVar12[1] = 0;
        *(char *)psVar1 = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)var_chain_1._M_dataplus._M_p != paVar21) {
          operator_delete(var_chain_1._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)var_chain._M_dataplus._M_p != &var_chain.field_2) {
          operator_delete(var_chain._M_dataplus._M_p);
        }
        CompilerGLSL::to_member_name_abi_cxx11_
                  (&var_chain_1,&this->super_CompilerGLSL,local_238,mbr_idx);
        if ((char)local_240 == '\0') {
          local_208._M_unused._M_object = &local_1f8;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"");
        }
        else {
          join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                    ((string *)&local_208,(spirv_cross *)0x2e933e,(char (*) [2])&local_25c,
                     (uint *)0x2f47bf,pacVar20);
        }
        join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,std::__cxx11::string>
                  (&var_chain,(spirv_cross *)var_chain_qual,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x314813,
                   (char (*) [2])&var_chain_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_3);
        if ((code **)local_208._M_unused._0_8_ != &local_1f8) {
          operator_delete(local_208._M_unused._M_object);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)var_chain_1._M_dataplus._M_p != paVar21) {
          operator_delete(var_chain_1._M_dataplus._M_p);
        }
        uVar8 = (uint32_t)
                (pSVar10->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
        if (uVar8 != 0) {
          mbr_idx_00 = 0;
          do {
            ts_3 = pSVar10;
            add_composite_member_variable_to_interface_block
                      (this,storage,ib_var_ref,local_258,local_230,pSVar10,mbr_idx_00,meta,&mbr_name
                       ,&var_chain,location,var_mbr_idx,&inherited_qual);
            *var_mbr_idx = *var_mbr_idx + 1;
            mbr_idx_00 = mbr_idx_00 + 1;
          } while (uVar8 != mbr_idx_00);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)var_chain._M_dataplus._M_p != &var_chain.field_2) {
          operator_delete(var_chain._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)mbr_name._M_dataplus._M_p != &mbr_name.field_2) {
          operator_delete(mbr_name._M_dataplus._M_p);
        }
        local_25c = local_25c + 1;
      } while (local_25c < local_244);
    }
  }
  else {
    local_25c = 0;
    if (local_244 != 0) {
      this_00 = &local_258->member_types;
      local_d8 = &(this->pull_model_inputs)._M_h;
      local_e8 = &(this->inputs_by_builtin)._M_h;
      local_e0 = &(this->outputs_by_builtin)._M_h;
      do {
        local_250 = CONCAT44(local_250._4_4_,
                             (int)(local_258->member_types).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                  buffer_size);
        if (storage == StorageClassInput) {
          mbr_name._M_dataplus._M_p._0_4_ = (local_230->super_IVariant).self.id;
          sVar13 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count(local_d8,(key_type_conflict *)&mbr_name);
          if (sVar13 == 0) goto LAB_001c1e04;
          uVar8 = build_msl_interpolant_type(this,(pSVar11->super_IVariant).self.id,local_25d);
        }
        else {
LAB_001c1e04:
          uVar8 = (pSVar11->super_IVariant).self.id;
        }
        pSVar10 = local_258;
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                  (this_00,(local_258->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                           buffer_size + 1);
        sVar2 = (pSVar10->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
        (pSVar10->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
        [sVar2].id = uVar8;
        (pSVar10->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
        buffer_size = sVar2 + 1;
        pSVar10 = local_238;
        append_member_name(&mbr_name,this,mbr_name_qual,local_238,mbr_idx);
        if ((char)local_240 == '\0') {
          var_chain_1._M_dataplus._M_p = (pointer)&var_chain_1.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&var_chain_1,"");
        }
        else {
          join<char_const(&)[2],unsigned_int&>
                    (&var_chain_1,(spirv_cross *)0x2f4e20,(char (*) [2])&local_25c,(uint *)pSVar10);
        }
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)mbr_name._M_dataplus._M_p != &mbr_name.field_2) {
          uVar19 = mbr_name.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < var_chain_1._M_string_length + mbr_name._M_string_length) {
          uVar19 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)var_chain_1._M_dataplus._M_p != &var_chain_1.field_2) {
            uVar19 = var_chain_1.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar19 < var_chain_1._M_string_length + mbr_name._M_string_length)
          goto LAB_001c1f0d;
          puVar12 = (undefined8 *)
                    ::std::__cxx11::string::replace
                              ((ulong)&var_chain_1,0,(char *)0x0,(ulong)mbr_name._M_dataplus._M_p);
        }
        else {
LAB_001c1f0d:
          puVar12 = (undefined8 *)
                    ::std::__cxx11::string::_M_append
                              ((char *)&mbr_name,(ulong)var_chain_1._M_dataplus._M_p);
        }
        psVar1 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_108.field_2._M_allocated_capacity = *psVar1;
          local_108.field_2._8_4_ = *(undefined4 *)(puVar12 + 3);
          local_108.field_2._12_4_ = *(undefined4 *)((long)puVar12 + 0x1c);
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        }
        else {
          local_108.field_2._M_allocated_capacity = *psVar1;
          local_108._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_108._M_string_length = puVar12[1];
        *puVar12 = psVar1;
        puVar12[1] = 0;
        *(undefined1 *)psVar1 = 0;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        this_01 = (CompilerMSL *)0x306109;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"m","");
        ensure_valid_name(&var_chain,this_01,&local_108,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)var_chain_1._M_dataplus._M_p != &var_chain_1.field_2) {
          operator_delete(var_chain_1._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)mbr_name._M_dataplus._M_p != &mbr_name.field_2) {
          operator_delete(mbr_name._M_dataplus._M_p);
        }
        Compiler::set_member_name
                  ((Compiler *)this,(TypeID)(local_258->super_IVariant).self.id,(uint32_t)local_250,
                   &var_chain);
        uVar8 = *location;
        if (uVar8 == 0xffffffff || bVar6) {
          bVar7 = Compiler::has_member_decoration
                            ((Compiler *)this,(TypeID)(local_238->super_IVariant).self.id,mbr_idx,
                             DecorationLocation);
          if (bVar7) {
            uVar8 = Compiler::get_member_decoration
                              ((Compiler *)this,(TypeID)(local_238->super_IVariant).self.id,mbr_idx,
                               DecorationLocation);
LAB_001c20d0:
            uVar8 = uVar8 + local_25c;
            *location = uVar8;
            goto LAB_001c20de;
          }
          bVar7 = Compiler::has_decoration
                            ((Compiler *)this,(ID)(local_230->super_IVariant).self.id,
                             DecorationLocation);
          if (bVar7) {
            uVar8 = CompilerGLSL::get_accumulated_member_location
                              (&this->super_CompilerGLSL,local_230,mbr_idx,meta->strip_array);
            goto LAB_001c20d0;
          }
          if ((bVar6) &&
             (bVar7 = Compiler::is_tessellation_shader((Compiler *)this),
             bVar7 && storage == StorageClassInput)) {
            mbr_name._M_dataplus._M_p._0_4_ = builtin;
            sVar14 = ::std::
                     _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::count(local_e8,(key_type_conflict *)&mbr_name);
            if (sVar14 == 0) goto LAB_001c253d;
            mbr_name._M_dataplus._M_p._0_4_ = builtin;
            pmVar15 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)local_e8,(key_type *)&mbr_name);
            uVar8 = local_25c + pmVar15->location;
            *location = uVar8;
            storage_00 = StorageClassInput;
            Compiler::set_member_decoration
                      ((Compiler *)this,(TypeID)(local_258->super_IVariant).self.id,
                       (uint32_t)local_250,DecorationLocation,uVar8);
            goto LAB_001c20fd;
          }
LAB_001c253d:
          if (((storage == StorageClassOutput && bVar6) & this->capture_output_to_buffer) == 1) {
            mbr_name._M_dataplus._M_p._0_4_ = builtin;
            sVar14 = ::std::
                     _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::count(local_e0,(key_type_conflict *)&mbr_name);
            if (sVar14 != 0) {
              mbr_name._M_dataplus._M_p._0_4_ = builtin;
              pmVar15 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)local_e0,(key_type *)&mbr_name);
              uVar8 = local_25c + pmVar15->location;
              *location = uVar8;
              storage_00 = StorageClassOutput;
              Compiler::set_member_decoration
                        ((Compiler *)this,(TypeID)(local_258->super_IVariant).self.id,
                         (uint32_t)local_250,DecorationLocation,uVar8);
              goto LAB_001c20fd;
            }
          }
          if ((bVar6) && (builtin - BuiltInClipDistance < 2)) {
            Compiler::set_member_decoration
                      ((Compiler *)this,(TypeID)(local_258->super_IVariant).self.id,
                       (uint32_t)local_250,DecorationBuiltIn,builtin);
            Compiler::set_member_decoration
                      ((Compiler *)this,(TypeID)(local_258->super_IVariant).self.id,
                       (uint32_t)local_250,DecorationIndex,local_25c);
          }
        }
        else {
LAB_001c20de:
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(local_258->super_IVariant).self.id,
                     (uint32_t)local_250,DecorationLocation,uVar8);
          storage_00 = storage;
LAB_001c20fd:
          mark_location_as_used_by_shader(this,*location,pSVar11,storage_00,false);
          *location = *location + 1;
        }
        bVar7 = Compiler::has_member_decoration
                          ((Compiler *)this,(TypeID)(local_238->super_IVariant).self.id,mbr_idx,
                           DecorationComponent);
        if (bVar7) {
          prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (prVar17,"DecorationComponent on matrices and arrays is not supported.");
          *(undefined ***)prVar17 = &PTR__runtime_error_003a8f30;
          __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (storage == StorageClassInput) {
          mbr_name._M_dataplus._M_p._0_4_ = (local_230->super_IVariant).self.id;
          sVar13 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count(local_d8,(key_type_conflict *)&mbr_name);
          if (sVar13 == 0) goto LAB_001c2179;
        }
        else {
LAB_001c2179:
          if (local_25f != false) {
            Compiler::set_member_decoration
                      ((Compiler *)this,(TypeID)(local_258->super_IVariant).self.id,
                       (uint32_t)local_250,DecorationFlat,0);
          }
          if (local_25d != false) {
            Compiler::set_member_decoration
                      ((Compiler *)this,(TypeID)(local_258->super_IVariant).self.id,
                       (uint32_t)local_250,DecorationNoPerspective,0);
          }
          if (local_261 != false) {
            Compiler::set_member_decoration
                      ((Compiler *)this,(TypeID)(local_258->super_IVariant).self.id,
                       (uint32_t)local_250,DecorationCentroid,0);
          }
          if (local_25e != false) {
            Compiler::set_member_decoration
                      ((Compiler *)this,(TypeID)(local_258->super_IVariant).self.id,
                       (uint32_t)local_250,DecorationSample,0);
          }
        }
        Compiler::set_extended_member_decoration
                  ((Compiler *)this,(local_258->super_IVariant).self.id,(uint32_t)local_250,
                   SPIRVCrossDecorationInterfaceOrigID,(local_230->super_IVariant).self.id);
        pacVar20 = (char (*) [2])(ulong)*var_mbr_idx;
        Compiler::set_extended_member_decoration
                  ((Compiler *)this,(local_258->super_IVariant).self.id,(uint32_t)local_250,
                   SPIRVCrossDecorationInterfaceMemberIndex,*var_mbr_idx);
        if ((meta->strip_array == false) && (meta->allow_local_declaration == true)) {
          CompilerGLSL::to_member_name_abi_cxx11_
                    (&mbr_name,&this->super_CompilerGLSL,local_238,mbr_idx);
          if ((char)local_240 == '\0') {
            local_208._M_unused._M_object = &local_1f8;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"");
          }
          else {
            join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                      ((string *)&local_208,(spirv_cross *)0x2e933e,(char (*) [2])&local_25c,
                       (uint *)0x2f47bf,pacVar20);
          }
          join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,std::__cxx11::string>
                    (&var_chain_1,(spirv_cross *)var_chain_qual,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x314813,
                     (char (*) [2])&mbr_name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_3);
          if ((code **)local_208._M_unused._0_8_ != &local_1f8) {
            operator_delete(local_208._M_unused._M_object);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)mbr_name._M_dataplus._M_p != &mbr_name.field_2) {
            operator_delete(mbr_name._M_dataplus._M_p);
          }
          if (storage == StorageClassInput) {
            mbr_name._M_dataplus._M_p = (pointer)local_230;
            mbr_name.field_2._M_local_buf[1] = local_25e;
            mbr_name.field_2._M_local_buf[0] = local_261;
            mbr_name.field_2._8_8_ = &local_1b8;
            mbr_name._M_string_length = (size_type)this;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)((long)&mbr_name.field_2 + 8),var_chain_1._M_dataplus._M_p,
                       var_chain_1._M_dataplus._M_p + var_chain_1._M_string_length);
            local_1a8 = &pcStack_198;
            pcVar4 = (ib_var_ref->_M_dataplus)._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1a8,pcVar4,pcVar4 + ib_var_ref->_M_string_length);
            local_188 = (code *)&uStack_178;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_188,var_chain._M_dataplus._M_p,
                       var_chain._M_dataplus._M_p + var_chain._M_string_length);
            local_1f8 = (code *)0x0;
            pcStack_1f0 = (code *)0x0;
            local_208._M_unused._M_object = (void *)0x0;
            local_208._8_8_ = 0;
            ppcVar16 = (code **)operator_new(0x78);
            *(undefined2 *)(ppcVar16 + 2) = mbr_name.field_2._M_allocated_capacity._0_2_;
            *(BuiltIn *)ppcVar16 = (BuiltIn)mbr_name._M_dataplus._M_p;
            *(undefined4 *)((long)ppcVar16 + 4) = mbr_name._M_dataplus._M_p._4_4_;
            *(undefined4 *)(ppcVar16 + 1) = (undefined4)mbr_name._M_string_length;
            *(undefined4 *)((long)ppcVar16 + 0xc) = mbr_name._M_string_length._4_4_;
            ppcVar16[3] = (code *)(ppcVar16 + 5);
            if ((uint *)mbr_name.field_2._8_8_ == &local_1b8) {
              *(uint *)(ppcVar16 + 5) = local_1b8;
              *(undefined4 *)((long)ppcVar16 + 0x2c) = uStack_1b4;
              *(undefined4 *)(ppcVar16 + 6) = (undefined4)uStack_1b0;
              *(undefined4 *)((long)ppcVar16 + 0x34) = uStack_1b0._4_4_;
            }
            else {
              ppcVar16[3] = (code *)mbr_name.field_2._8_8_;
              ppcVar16[5] = (code *)CONCAT44(uStack_1b4,local_1b8);
            }
            ppcVar16[4] = local_1c0;
            local_1c0 = (code *)0x0;
            local_1b8 = local_1b8 & 0xffffff00;
            ppcVar16[7] = (code *)(ppcVar16 + 9);
            mbr_name.field_2._8_8_ = &local_1b8;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)(ppcVar16 + 7),local_1a8,
                       (code *)((long)local_1a8 + CONCAT71(uStack_19f,local_1a0)));
            ppcVar16[0xb] = (code *)(ppcVar16 + 0xd);
            if (local_188 == (code *)&uStack_178) {
              ppcVar16[0xd] = (code *)CONCAT71(uStack_177,uStack_178);
              ppcVar16[0xe] = (code *)CONCAT44(uStack_16c,local_170);
            }
            else {
              ppcVar16[0xb] = local_188;
              ppcVar16[0xd] = (code *)CONCAT71(uStack_177,uStack_178);
            }
            ppcVar16[0xc] = local_180;
            local_180 = (code *)0x0;
            uStack_178 = (code)0x0;
            pcStack_1f0 = ::std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3143:41)>
                          ::_M_invoke;
            local_1f8 = ::std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3143:41)>
                        ::_M_manager;
            local_208._M_unused._0_8_ = ppcVar16;
            local_188 = (code *)&uStack_178;
            SmallVector<std::function<void_()>,_0UL>::push_back
                      (&pSVar9->fixup_hooks_in,(function<void_()> *)&local_208);
            if (local_1f8 != (code *)0x0) {
              (*local_1f8)(&local_208,&local_208,3);
            }
            if (local_188 != (code *)&uStack_178) {
              operator_delete(local_188);
            }
            if (local_1a8 != &pcStack_198) {
              operator_delete(local_1a8);
            }
            uVar19 = mbr_name.field_2._8_8_;
            if ((uint *)mbr_name.field_2._8_8_ != &local_1b8) {
LAB_001c2a28:
              operator_delete((void *)uVar19);
            }
          }
          else if (storage == StorageClassOutput) {
            mbr_name._M_dataplus._M_p._0_1_ = (char)local_1e4;
            mbr_name.field_2._M_allocated_capacity = (size_type)&local_1c0;
            pcVar4 = (ib_var_ref->_M_dataplus)._M_p;
            mbr_name._M_string_length = (size_type)this;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&mbr_name.field_2,pcVar4,pcVar4 + ib_var_ref->_M_string_length);
            uStack_1b0 = (code *)&local_1a0;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&uStack_1b0,var_chain._M_dataplus._M_p,
                       var_chain._M_dataplus._M_p + var_chain._M_string_length);
            local_190 = &local_180;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_190,flatten_from_ib_mbr_name._M_dataplus._M_p,
                       flatten_from_ib_mbr_name._M_dataplus._M_p +
                       flatten_from_ib_mbr_name._M_string_length);
            local_170 = local_25c;
            local_168 = (code *)&local_158;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_168,var_chain_1._M_dataplus._M_p,
                       var_chain_1._M_dataplus._M_p + var_chain_1._M_string_length);
            local_1f8 = (code *)0x0;
            pcStack_1f0 = (code *)0x0;
            local_208._M_unused._M_object = (void *)0x0;
            local_208._8_8_ = 0;
            ppcVar16 = (code **)operator_new(0x98);
            *(BuiltIn *)ppcVar16 = (BuiltIn)mbr_name._M_dataplus._M_p;
            *(undefined4 *)((long)ppcVar16 + 4) = mbr_name._M_dataplus._M_p._4_4_;
            *(undefined4 *)(ppcVar16 + 1) = (undefined4)mbr_name._M_string_length;
            *(undefined4 *)((long)ppcVar16 + 0xc) = mbr_name._M_string_length._4_4_;
            ppcVar16[2] = (code *)(ppcVar16 + 4);
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)(ppcVar16 + 2),mbr_name.field_2._M_allocated_capacity,
                       mbr_name.field_2._8_8_ + mbr_name.field_2._M_allocated_capacity);
            ppcVar16[6] = (code *)(ppcVar16 + 8);
            if (uStack_1b0 == (code *)&local_1a0) {
              ppcVar16[8] = (code *)CONCAT71(uStack_19f,local_1a0);
              ppcVar16[9] = pcStack_198;
            }
            else {
              ppcVar16[6] = uStack_1b0;
              ppcVar16[8] = (code *)CONCAT71(uStack_19f,local_1a0);
            }
            ppcVar16[7] = (code *)local_1a8;
            local_1a8 = (code **)0x0;
            local_1a0 = (code)0x0;
            ppcVar16[10] = (code *)(ppcVar16 + 0xc);
            if (local_190 == &local_180) {
              ppcVar16[0xc] = local_180;
              ppcVar16[0xd] = (code *)CONCAT71(uStack_177,uStack_178);
            }
            else {
              ppcVar16[10] = (code *)local_190;
              ppcVar16[0xc] = local_180;
            }
            ppcVar16[0xb] = local_188;
            local_188 = (code *)0x0;
            local_180 = (code *)((ulong)local_180 & 0xffffffffffffff00);
            *(uint *)(ppcVar16 + 0xe) = local_170;
            ppcVar16[0xf] = (code *)(ppcVar16 + 0x11);
            if (local_168 == (code *)&local_158) {
              ppcVar16[0x11] = (code *)CONCAT71(uStack_157,local_158);
              ppcVar16[0x12] = pcStack_150;
            }
            else {
              ppcVar16[0xf] = local_168;
              ppcVar16[0x11] = (code *)CONCAT71(uStack_157,local_158);
            }
            ppcVar16[0x10] = local_160;
            local_160 = (code *)0x0;
            local_158 = (code)0x0;
            pcStack_1f0 = ::std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3159:42)>
                          ::_M_invoke;
            local_1f8 = ::std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3159:42)>
                        ::_M_manager;
            local_208._M_unused._0_8_ = (undefined8)ppcVar16;
            uStack_1b0 = (code *)&local_1a0;
            local_190 = &local_180;
            local_168 = (code *)&local_158;
            SmallVector<std::function<void_()>,_0UL>::push_back
                      (&pSVar9->fixup_hooks_out,(function<void_()> *)&local_208);
            if (local_1f8 != (code *)0x0) {
              (*local_1f8)(&local_208,&local_208,3);
            }
            if (local_168 != (code *)&local_158) {
              operator_delete(local_168);
            }
            if (local_190 != &local_180) {
              operator_delete(local_190);
            }
            if (uStack_1b0 != (code *)&local_1a0) {
              operator_delete(uStack_1b0);
            }
            uVar19 = mbr_name.field_2._M_allocated_capacity;
            if ((code **)mbr_name.field_2._M_allocated_capacity != &local_1c0) goto LAB_001c2a28;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)var_chain_1._M_dataplus._M_p != &var_chain_1.field_2) {
            operator_delete(var_chain_1._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)var_chain._M_dataplus._M_p != &var_chain.field_2) {
          operator_delete(var_chain._M_dataplus._M_p);
        }
        local_25c = local_25c + 1;
      } while (local_25c < local_244);
    }
  }
LAB_001c2a6f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)flatten_from_ib_mbr_name._M_dataplus._M_p != &flatten_from_ib_mbr_name.field_2) {
    operator_delete(flatten_from_ib_mbr_name._M_dataplus._M_p);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&inherited_qual.higher._M_h);
  return;
}

Assistant:

void CompilerMSL::add_composite_member_variable_to_interface_block(StorageClass storage,
                                                                   const string &ib_var_ref, SPIRType &ib_type,
                                                                   SPIRVariable &var, SPIRType &var_type,
                                                                   uint32_t mbr_idx, InterfaceBlockMeta &meta,
                                                                   const string &mbr_name_qual,
                                                                   const string &var_chain_qual,
                                                                   uint32_t &location, uint32_t &var_mbr_idx,
                                                                   const Bitset &interpolation_qual)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);

	BuiltIn builtin = BuiltInMax;
	bool is_builtin = is_member_builtin(var_type, mbr_idx, &builtin);
	bool is_flat = interpolation_qual.get(DecorationFlat) ||
	               has_member_decoration(var_type.self, mbr_idx, DecorationFlat) ||
	               has_decoration(var.self, DecorationFlat);
	bool is_noperspective = interpolation_qual.get(DecorationNoPerspective) ||
	                        has_member_decoration(var_type.self, mbr_idx, DecorationNoPerspective) ||
	                        has_decoration(var.self, DecorationNoPerspective);
	bool is_centroid = interpolation_qual.get(DecorationCentroid) ||
	                   has_member_decoration(var_type.self, mbr_idx, DecorationCentroid) ||
	                   has_decoration(var.self, DecorationCentroid);
	bool is_sample = interpolation_qual.get(DecorationSample) ||
	                 has_member_decoration(var_type.self, mbr_idx, DecorationSample) ||
	                 has_decoration(var.self, DecorationSample);

	Bitset inherited_qual;
	if (is_flat)
		inherited_qual.set(DecorationFlat);
	if (is_noperspective)
		inherited_qual.set(DecorationNoPerspective);
	if (is_centroid)
		inherited_qual.set(DecorationCentroid);
	if (is_sample)
		inherited_qual.set(DecorationSample);

	uint32_t mbr_type_id = var_type.member_types[mbr_idx];
	auto &mbr_type = get<SPIRType>(mbr_type_id);

	bool mbr_is_indexable = false;
	uint32_t elem_cnt = 1;
	if (is_matrix(mbr_type))
	{
		if (is_array(mbr_type))
			SPIRV_CROSS_THROW("MSL cannot emit arrays-of-matrices in input and output variables.");

		mbr_is_indexable = true;
		elem_cnt = mbr_type.columns;
	}
	else if (is_array(mbr_type))
	{
		if (mbr_type.array.size() != 1)
			SPIRV_CROSS_THROW("MSL cannot emit arrays-of-arrays in input and output variables.");

		mbr_is_indexable = true;
		elem_cnt = to_array_size_literal(mbr_type);
	}

	auto *usable_type = &mbr_type;
	if (usable_type->pointer)
		usable_type = &get<SPIRType>(usable_type->parent_type);
	while (is_array(*usable_type) || is_matrix(*usable_type))
		usable_type = &get<SPIRType>(usable_type->parent_type);

	bool flatten_from_ib_var = false;
	string flatten_from_ib_mbr_name;

	if (storage == StorageClassOutput && is_builtin && builtin == BuiltInClipDistance)
	{
		// Also declare [[clip_distance]] attribute here.
		uint32_t clip_array_mbr_idx = uint32_t(ib_type.member_types.size());
		ib_type.member_types.push_back(mbr_type_id);
		set_member_decoration(ib_type.self, clip_array_mbr_idx, DecorationBuiltIn, BuiltInClipDistance);

		flatten_from_ib_mbr_name = builtin_to_glsl(BuiltInClipDistance, StorageClassOutput);
		set_member_name(ib_type.self, clip_array_mbr_idx, flatten_from_ib_mbr_name);

		// When we flatten, we flatten directly from the "out" struct,
		// not from a function variable.
		flatten_from_ib_var = true;

		if (!msl_options.enable_clip_distance_user_varying)
			return;
	}

	// Recursively handle nested structures.
	if (mbr_type.basetype == SPIRType::Struct)
	{
		for (uint32_t i = 0; i < elem_cnt; i++)
		{
			string mbr_name = append_member_name(mbr_name_qual, var_type, mbr_idx) + (mbr_is_indexable ? join("_", i) : "");
			string var_chain = join(var_chain_qual, ".", to_member_name(var_type, mbr_idx), (mbr_is_indexable ? join("[", i, "]") : ""));
			uint32_t sub_mbr_cnt = uint32_t(mbr_type.member_types.size());
			for (uint32_t sub_mbr_idx = 0; sub_mbr_idx < sub_mbr_cnt; sub_mbr_idx++)
			{
				add_composite_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
																 var, mbr_type, sub_mbr_idx,
																 meta, mbr_name, var_chain,
																 location, var_mbr_idx, inherited_qual);
				// FIXME: Recursive structs and tessellation breaks here.
				var_mbr_idx++;
			}
		}
		return;
	}

	for (uint32_t i = 0; i < elem_cnt; i++)
	{
		// Add a reference to the variable type to the interface struct.
		uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());
		if (storage == StorageClassInput && pull_model_inputs.count(var.self))
			ib_type.member_types.push_back(build_msl_interpolant_type(usable_type->self, is_noperspective));
		else
			ib_type.member_types.push_back(usable_type->self);

		// Give the member a name
		string mbr_name = ensure_valid_name(append_member_name(mbr_name_qual, var_type, mbr_idx) + (mbr_is_indexable ? join("_", i) : ""), "m");
		set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

		// Once we determine the location of the first member within nested structures,
		// from a var of the topmost structure, the remaining flattened members of
		// the nested structures will have consecutive location values. At this point,
		// we've recursively tunnelled into structs, arrays, and matrices, and are
		// down to a single location for each member now.
		if (!is_builtin && location != UINT32_MAX)
		{
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
			mark_location_as_used_by_shader(location, *usable_type, storage);
			location++;
		}
		else if (has_member_decoration(var_type.self, mbr_idx, DecorationLocation))
		{
			location = get_member_decoration(var_type.self, mbr_idx, DecorationLocation) + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
			mark_location_as_used_by_shader(location, *usable_type, storage);
			location++;
		}
		else if (has_decoration(var.self, DecorationLocation))
		{
			location = get_accumulated_member_location(var, mbr_idx, meta.strip_array) + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
			mark_location_as_used_by_shader(location, *usable_type, storage);
			location++;
		}
		else if (is_builtin && is_tessellation_shader() && storage == StorageClassInput && inputs_by_builtin.count(builtin))
		{
			location = inputs_by_builtin[builtin].location + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
			mark_location_as_used_by_shader(location, *usable_type, storage);
			location++;
		}
		else if (is_builtin && capture_output_to_buffer && storage == StorageClassOutput && outputs_by_builtin.count(builtin))
		{
			location = outputs_by_builtin[builtin].location + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
			mark_location_as_used_by_shader(location, *usable_type, storage);
			location++;
		}
		else if (is_builtin && (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance))
		{
			// Declare the Clip/CullDistance as [[user(clip/cullN)]].
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationIndex, i);
		}

		if (has_member_decoration(var_type.self, mbr_idx, DecorationComponent))
			SPIRV_CROSS_THROW("DecorationComponent on matrices and arrays is not supported.");

		if (storage != StorageClassInput || !pull_model_inputs.count(var.self))
		{
			// Copy interpolation decorations if needed
			if (is_flat)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationFlat);
			if (is_noperspective)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationNoPerspective);
			if (is_centroid)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationCentroid);
			if (is_sample)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationSample);
		}

		set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceOrigID, var.self);
		set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceMemberIndex, var_mbr_idx);

		// Unflatten or flatten from [[stage_in]] or [[stage_out]] as appropriate.
		if (!meta.strip_array && meta.allow_local_declaration)
		{
			string var_chain = join(var_chain_qual, ".", to_member_name(var_type, mbr_idx), (mbr_is_indexable ? join("[", i, "]") : ""));
			switch (storage)
			{
			case StorageClassInput:
				entry_func.fixup_hooks_in.push_back([=, &var]() {
					string lerp_call;
					if (pull_model_inputs.count(var.self))
					{
						if (is_centroid)
							lerp_call = ".interpolate_at_centroid()";
						else if (is_sample)
							lerp_call = join(".interpolate_at_sample(", to_expression(builtin_sample_id_id), ")");
						else
							lerp_call = ".interpolate_at_center()";
					}
					statement(var_chain, " = ", ib_var_ref, ".", mbr_name, lerp_call, ";");
				});
				break;

			case StorageClassOutput:
				entry_func.fixup_hooks_out.push_back([=]() {
					if (flatten_from_ib_var)
						statement(ib_var_ref, ".", mbr_name, " = ", ib_var_ref, ".", flatten_from_ib_mbr_name, "[", i, "];");
					else
						statement(ib_var_ref, ".", mbr_name, " = ", var_chain, ";");
				});
				break;

			default:
				break;
			}
		}
	}
}